

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86::forward
          (DeconvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  Layer *pLVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar17;
  undefined4 uVar18;
  bool bVar19;
  Mat *pMVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  sbyte sVar32;
  undefined4 *puVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  int iVar38;
  undefined1 (*pauVar39) [16];
  long lVar40;
  byte bVar41;
  ulong uVar42;
  ulong uVar43;
  void *pvVar44;
  int iVar45;
  long lVar46;
  ulong uVar47;
  int iVar48;
  int x;
  undefined1 auVar49 [16];
  undefined1 extraout_var [12];
  float fVar50;
  float fVar51;
  float fVar52;
  v4sf one;
  float fVar53;
  float fVar54;
  float fVar61;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [12];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_280;
  void *local_260;
  int local_258;
  Mat local_248;
  Mat *local_200;
  ulong local_1f8;
  undefined1 (*local_1f0) [16];
  Mat local_1e8;
  size_t local_1a0;
  void *local_198;
  int local_18c;
  undefined1 local_188 [16];
  Mat local_170;
  long local_128;
  void *local_120;
  void *local_118;
  long local_110;
  void *local_108;
  int *local_100;
  Allocator *local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  ulong local_c8;
  void *local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar29 = bottom_blob->w;
  iVar45 = bottom_blob->h;
  uVar30 = bottom_blob->c;
  iVar48 = bottom_blob->elempack;
  iVar35 = (this->super_DeconvolutionDepthWise).dilation_w;
  uVar27 = (this->super_DeconvolutionDepthWise).num_output;
  iVar4 = (this->super_DeconvolutionDepthWise).stride_w;
  iVar37 = ((this->super_DeconvolutionDepthWise).kernel_h + -1) *
           (this->super_DeconvolutionDepthWise).dilation_h;
  iVar22 = (this->super_DeconvolutionDepthWise).stride_h;
  bVar41 = (uVar27 & 3) == 0 & opt->use_packing_layout;
  iVar38 = (this->super_DeconvolutionDepthWise).kernel_w;
  iVar26 = (this->super_DeconvolutionDepthWise).output_pad_right;
  iVar34 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (long)iVar48;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = bottom_blob->elemsize;
  sVar32 = bVar41 * '\x02';
  uVar43 = SUB168(auVar12 / auVar11,0) << sVar32;
  local_248.cstep = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  auVar55._0_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_left);
  auVar55._4_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_right);
  auVar55._8_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_top);
  auVar55._12_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_bottom);
  iVar21 = movmskps(SUB164(auVar12 / auVar11,0),auVar55);
  lVar46 = 0x10;
  if ((iVar21 == 0) &&
     ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
       ((this->super_DeconvolutionDepthWise).output_h < 1)) && (lVar46 = 8, &local_248 != top_blob))
     )) {
    piVar6 = top_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_248.data = top_blob->data;
    local_248.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_248.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_248.elemsize = top_blob->elemsize;
    local_248.elempack = top_blob->elempack;
    local_248.allocator = top_blob->allocator;
    uVar17 = top_blob->dims;
    uVar18 = top_blob->w;
    local_248.h = top_blob->h;
    local_248.d = top_blob->d;
    local_248.c = top_blob->c;
    local_248.cstep = top_blob->cstep;
    uVar27 = (this->super_DeconvolutionDepthWise).num_output;
    local_248.dims = uVar17;
    local_248.w = uVar18;
  }
  iVar35 = (iVar38 + -1) * iVar35;
  iVar38 = iVar26 + (iVar29 + -1) * iVar4 + iVar35 + 1;
  iVar4 = iVar34 + 1 + (iVar45 + -1) * iVar22 + iVar37;
  uVar36 = (uint)bVar41 * 3 + 1;
  local_200 = top_blob;
  Mat::create(&local_248,iVar38,iVar4,(int)uVar27 / (int)uVar36,uVar43,uVar36,
              *(Allocator **)(&opt->lightmode + lVar46));
  auVar12 = _DAT_005b4860;
  auVar11 = _DAT_005b4820;
  iVar22 = -100;
  if ((local_248.data == (void *)0x0) ||
     (local_1a0 = local_248.cstep, (long)local_248.c * local_248.cstep == 0)) goto LAB_00433f88;
  iVar22 = (this->super_DeconvolutionDepthWise).num_output;
  iVar26 = (this->super_DeconvolutionDepthWise).group;
  if (iVar26 == iVar22 && uVar30 * iVar48 == iVar26) {
    iVar22 = (this->super_DeconvolutionDepthWise).kernel_h *
             (this->super_DeconvolutionDepthWise).kernel_w;
    local_188._0_4_ = iVar22;
    if (iVar48 == 1) {
      local_118 = local_248.data;
      if (0 < (int)uVar30) {
        local_1a0 = local_248.cstep * local_248.elemsize;
        local_260 = (this->weight_data_tm).data;
        iVar48 = bottom_blob->w;
        local_120 = bottom_blob->data;
        sVar8 = bottom_blob->elemsize;
        local_128 = bottom_blob->cstep * sVar8;
        local_110 = (long)iVar22 << 2;
        local_280 = 0;
        do {
          pvVar7 = local_120;
          if (0 < iVar4) {
            lVar46 = local_128 * local_280;
            puVar33 = (undefined4 *)(local_1a0 * local_280 + (long)local_118);
            uVar27 = (this->super_DeconvolutionDepthWise).kernel_h;
            local_1f0 = (undefined1 (*) [16])
                        CONCAT44(local_1f0._4_4_,(this->super_DeconvolutionDepthWise).bias_term);
            local_1f8 = (ulong)((this->super_DeconvolutionDepthWise).activation_type - 1);
            iVar22 = 0;
            do {
              local_18c = iVar22;
              if (0 < iVar38) {
                local_198 = (this->super_DeconvolutionDepthWise).bias_data.data;
                iVar26 = (this->super_DeconvolutionDepthWise).dilation_h;
                iVar21 = local_18c - iVar37;
                pfVar1 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                iVar34 = 0;
                iVar22 = -iVar35;
                do {
                  if ((int)local_1f0 == 0) {
                    auVar62 = ZEXT812(0);
                  }
                  else {
                    auVar62._4_8_ = 0;
                    auVar62._0_4_ = *(uint *)((long)local_198 + local_280 * 4);
                  }
                  auVar49._12_4_ = 0;
                  auVar49._0_12_ = auVar62;
                  if (0 < (int)uVar27) {
                    iVar5 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar36 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar23 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar43 = 0;
                    pvVar44 = local_260;
                    do {
                      iVar24 = iVar26 * (int)uVar43 + iVar21;
                      if (((-1 < iVar24) &&
                          (iVar25 = iVar24 / iVar5, iVar25 < iVar45 && iVar24 % iVar5 == 0)) &&
                         (0 < (int)uVar36)) {
                        uVar42 = 0;
                        iVar24 = iVar22;
                        do {
                          if ((-1 < iVar24) &&
                             (iVar31 = iVar24 / iVar23, iVar31 < iVar29 && iVar24 % iVar23 == 0)) {
                            auVar49._0_4_ =
                                 auVar49._0_4_ +
                                 *(float *)((long)pvVar44 + uVar42 * 4) *
                                 *(float *)((long)pvVar7 +
                                           (long)iVar31 * 4 +
                                           (long)iVar25 * (long)iVar48 * sVar8 + lVar46);
                          }
                          uVar42 = uVar42 + 1;
                          iVar24 = iVar24 + (this->super_DeconvolutionDepthWise).dilation_w;
                        } while (uVar36 != uVar42);
                      }
                      uVar43 = uVar43 + 1;
                      pvVar44 = (void *)((long)pvVar44 + (ulong)uVar36 * 4);
                    } while (uVar43 != uVar27);
                  }
                  fVar50 = auVar49._0_4_;
                  auVar59 = auVar49;
                  if ((uint)local_1f8 < 6) {
                    switch((long)&switchD_00433b8f::switchdataD_005bec08 +
                           (long)(int)(&switchD_00433b8f::switchdataD_005bec08)[local_1f8]) {
                    case 0x433b91:
                      if (fVar50 <= 0.0) {
                        auVar65._12_4_ = 0;
                        auVar65._0_12_ = auVar49._4_12_;
                        auVar59 = auVar65 << 0x20;
                      }
                      break;
                    case 0x433ba1:
                      local_188 = auVar49;
                      fVar50 = expf(fVar50);
                      fVar50 = logf(fVar50 + 1.0);
                      fVar50 = tanhf(fVar50);
                      auVar59._0_4_ = fVar50 * (float)local_188._0_4_;
                      auVar59._4_12_ = extraout_var;
                      break;
                    case 0x433bd1:
                      if (fVar50 <= *pfVar1) {
                        auVar49._0_4_ = *pfVar1;
                      }
                      fVar50 = pfVar1[1];
                      auVar59 = auVar49;
                      if (fVar50 < auVar49._0_4_) {
LAB_00433cea:
                        auVar59 = ZEXT416((uint)fVar50);
                      }
                      break;
                    case 0x433bf9:
                      if (88.37626 <= fVar50) {
                        fVar50 = 88.37626;
                      }
                      fVar50 = expf((float)(-(uint)(fVar50 < -88.37626) & 0x42b0c0a5 |
                                           ~-(uint)(fVar50 < -88.37626) & (uint)-fVar50));
                      auVar59 = ZEXT416((uint)(1.0 / (fVar50 + 1.0)));
                      break;
                    case 0x433c41:
                      auVar59 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar50) & (uint)*pfVar1 |
                                                      -(uint)(0.0 < fVar50) & 0x3f800000) * fVar50))
                      ;
                      break;
                    case 0x433c6c:
                      fVar51 = *pfVar1;
                      fVar52 = -pfVar1[1] / fVar51;
                      auVar59 = ZEXT816(0);
                      if ((fVar52 <= fVar50) && (auVar59 = auVar49, fVar50 <= fVar52 + 1.0 / fVar51)
                         ) {
                        fVar50 = (fVar51 * fVar50 + pfVar1[1]) * fVar50;
                        goto LAB_00433cea;
                      }
                    }
                  }
                  *puVar33 = auVar59._0_4_;
                  puVar33 = puVar33 + 1;
                  iVar34 = iVar34 + 1;
                  iVar22 = iVar22 + 1;
                } while (iVar34 != iVar38);
              }
              iVar22 = local_18c + 1;
            } while (local_18c + 1 != iVar4);
          }
          local_280 = local_280 + 1;
          local_260 = (void *)((long)local_260 + local_110);
        } while (local_280 != uVar30);
      }
    }
    else if ((iVar48 == 4) && (0 < (int)uVar30)) {
      local_188._0_4_ = iVar22 * 4;
      local_260 = (void *)0x0;
      auVar49 = (undefined1  [16])0x0;
      fVar50 = (float)DAT_005b4860;
      fVar51 = DAT_005b4860._4_4_;
      fVar52 = DAT_005b4860._8_4_;
      auVar55 = _DAT_005b4830;
      do {
        if (0 < iVar4) {
          pvVar7 = (this->weight_data_tm).data;
          sVar8 = bottom_blob->cstep;
          sVar9 = bottom_blob->elemsize;
          pvVar44 = bottom_blob->data;
          iVar48 = bottom_blob->w;
          pauVar39 = (undefined1 (*) [16])
                     (local_248.cstep * (long)local_260 * local_248.elemsize + (long)local_248.data)
          ;
          local_198 = (void *)((long)local_260 * 0x10);
          iVar26 = 0;
          do {
            if (0 < iVar38) {
              iVar34 = 0;
              local_258 = -iVar35;
              do {
                local_1f0 = pauVar39;
                if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                  auVar64 = ZEXT816(0);
                }
                else {
                  auVar64 = *(undefined1 (*) [16])
                             ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                             (long)local_198);
                }
                local_1f8 = CONCAT44(local_1f8._4_4_,iVar34);
                lVar46 = (long)(this->super_DeconvolutionDepthWise).kernel_h;
                if (0 < lVar46) {
                  iVar21 = (this->super_DeconvolutionDepthWise).stride_h;
                  uVar27 = (this->super_DeconvolutionDepthWise).kernel_w;
                  iVar5 = (this->super_DeconvolutionDepthWise).stride_w;
                  uVar43 = 0;
                  lVar40 = 0;
                  do {
                    iVar23 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar40 +
                             (iVar26 - iVar37);
                    if ((((-1 < iVar23) && (iVar24 = iVar23 / iVar21, iVar23 % iVar21 == 0)) &&
                        (iVar24 < iVar45)) && (0 < (int)uVar27)) {
                      uVar42 = (ulong)uVar27;
                      uVar47 = uVar43;
                      auVar59 = auVar64;
                      iVar23 = local_258;
                      do {
                        auVar64 = auVar59;
                        if ((-1 < iVar23) &&
                           (iVar25 = iVar23 / iVar5, iVar25 < iVar29 && iVar23 % iVar5 == 0)) {
                          auVar65 = *(undefined1 (*) [16])
                                     ((long)pvVar44 +
                                     (long)(iVar25 << 2) * 4 +
                                     (long)iVar24 * (long)iVar48 * sVar9 +
                                     sVar8 * (long)local_260 * sVar9);
                          pfVar1 = (float *)((long)pvVar7 +
                                            (uVar47 & 0xffffffff) * 4 +
                                            (long)(iVar22 * 4 * (int)local_260) * 4);
                          auVar64._0_4_ = auVar59._0_4_ + *pfVar1 * auVar65._0_4_;
                          auVar64._4_4_ = auVar59._4_4_ + pfVar1[1] * auVar65._4_4_;
                          auVar64._8_4_ = auVar59._8_4_ + pfVar1[2] * auVar65._8_4_;
                          auVar64._12_4_ = auVar59._12_4_ + pfVar1[3] * auVar65._12_4_;
                        }
                        iVar23 = iVar23 + (this->super_DeconvolutionDepthWise).dilation_w;
                        uVar47 = uVar47 + 4;
                        uVar42 = uVar42 - 1;
                        auVar59 = auVar64;
                      } while (uVar42 != 0);
                    }
                    lVar40 = lVar40 + 1;
                    uVar43 = uVar43 + (ulong)uVar27 * 4;
                  } while (lVar40 != lVar46);
                }
                fVar54 = auVar64._4_4_;
                fVar67 = auVar64._8_4_;
                fVar61 = auVar64._12_4_;
                fVar53 = auVar12._12_4_;
                switch((this->super_DeconvolutionDepthWise).activation_type) {
                case 1:
                  auVar64 = maxps(auVar64,auVar49);
                  break;
                case 2:
                  auVar59 = maxps(auVar64,auVar49);
                  auVar65 = minps(auVar64,auVar49);
                  fVar53 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar64._4_4_ = fVar53 * auVar65._4_4_ + auVar59._4_4_;
                  auVar64._0_4_ = fVar53 * auVar65._0_4_ + auVar59._0_4_;
                  auVar64._8_4_ = fVar53 * auVar65._8_4_ + auVar59._8_4_;
                  auVar64._12_4_ = fVar53 * auVar65._12_4_ + auVar59._12_4_;
                  break;
                case 3:
                  puVar33 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar2 = *puVar33;
                  uVar3 = puVar33[1];
                  auVar57._4_4_ = uVar2;
                  auVar57._0_4_ = uVar2;
                  auVar57._8_4_ = uVar2;
                  auVar57._12_4_ = uVar2;
                  auVar59 = maxps(auVar64,auVar57);
                  auVar16._4_4_ = uVar3;
                  auVar16._0_4_ = uVar3;
                  auVar16._8_4_ = uVar3;
                  auVar16._12_4_ = uVar3;
                  auVar64 = minps(auVar59,auVar16);
                  break;
                case 4:
                  auVar63._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
                  auVar63._8_4_ = -fVar67;
                  auVar63._12_4_ = -fVar61;
                  auVar59 = minps(auVar63,auVar11);
                  auVar59 = maxps(auVar59,auVar55);
                  fVar67 = auVar59._0_4_ * 1.442695 + 0.5;
                  fVar71 = auVar59._4_4_ * 1.442695 + 0.5;
                  fVar73 = auVar59._8_4_ * 1.442695 + 0.5;
                  fVar66 = auVar59._12_4_ * 1.442695 + 0.5;
                  fVar54 = (float)(int)fVar67;
                  fVar61 = (float)(int)fVar71;
                  fVar72 = (float)(int)fVar73;
                  fVar74 = (float)(int)fVar66;
                  fVar54 = fVar54 - (float)(-(uint)(fVar67 < fVar54) & (uint)fVar50);
                  fVar61 = fVar61 - (float)(-(uint)(fVar71 < fVar61) & (uint)fVar51);
                  fVar72 = fVar72 - (float)(-(uint)(fVar73 < fVar72) & (uint)fVar52);
                  fVar74 = fVar74 - (float)(-(uint)(fVar66 < fVar74) & (uint)fVar53);
                  fVar67 = fVar54 * -0.6931472 + auVar59._0_4_;
                  fVar71 = fVar61 * -0.6931472 + auVar59._4_4_;
                  fVar73 = fVar72 * -0.6931472 + auVar59._8_4_;
                  fVar66 = fVar74 * -0.6931472 + auVar59._12_4_;
                  auVar15._4_4_ =
                       (float)((int)fVar61 * 0x800000 + (int)fVar51) *
                       (fVar71 + fVar51 +
                       (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71
                         + 0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) * fVar71 * fVar71) +
                       fVar51;
                  auVar15._0_4_ =
                       (float)((int)fVar54 * 0x800000 + (int)fVar50) *
                       (fVar67 + fVar50 +
                       (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67
                         + 0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67) +
                       fVar50;
                  auVar15._8_4_ =
                       (float)((int)fVar72 * 0x800000 + (int)fVar52) *
                       (fVar73 + fVar52 +
                       (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73
                         + 0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73) +
                       fVar52;
                  auVar15._12_4_ =
                       (float)((int)fVar74 * 0x800000 + (int)fVar53) *
                       (fVar66 + fVar53 +
                       (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66
                         + 0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66) +
                       fVar53;
                  auVar64 = divps(auVar12,auVar15);
                  break;
                case 5:
                  auVar49 = minps(auVar64,auVar11);
                  auVar55 = maxps(auVar49,auVar55);
                  fVar71 = auVar55._0_4_ * 1.442695 + 0.5;
                  fVar72 = auVar55._4_4_ * 1.442695 + 0.5;
                  fVar73 = auVar55._8_4_ * 1.442695 + 0.5;
                  fVar74 = auVar55._12_4_ * 1.442695 + 0.5;
                  fVar66 = (float)(int)fVar71;
                  fVar68 = (float)(int)fVar72;
                  fVar69 = (float)(int)fVar73;
                  fVar70 = (float)(int)fVar74;
                  fVar66 = fVar66 - (float)(-(uint)(fVar71 < fVar66) & (uint)fVar50);
                  fVar68 = fVar68 - (float)(-(uint)(fVar72 < fVar68) & (uint)fVar51);
                  fVar69 = fVar69 - (float)(-(uint)(fVar73 < fVar69) & (uint)fVar52);
                  fVar70 = fVar70 - (float)(-(uint)(fVar74 < fVar70) & (uint)fVar53);
                  fVar71 = auVar55._0_4_ - fVar66 * 0.6931472;
                  fVar72 = auVar55._4_4_ - fVar68 * 0.6931472;
                  fVar73 = auVar55._8_4_ - fVar69 * 0.6931472;
                  fVar74 = auVar55._12_4_ - fVar70 * 0.6931472;
                  auVar75._0_4_ =
                       (float)((int)fVar66 * 0x800000 + (int)fVar50) *
                       (fVar71 + fVar50 +
                       (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71
                         + 0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) * fVar71 * fVar71) +
                       fVar50;
                  auVar75._4_4_ =
                       (float)((int)fVar68 * 0x800000 + (int)fVar51) *
                       (fVar72 + fVar51 +
                       (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72
                         + 0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72) +
                       fVar51;
                  auVar75._8_4_ =
                       (float)((int)fVar69 * 0x800000 + (int)fVar52) *
                       (fVar73 + fVar52 +
                       (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73
                         + 0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73) +
                       fVar52;
                  auVar75._12_4_ =
                       (float)((int)fVar70 * 0x800000 + (int)fVar53) *
                       (fVar74 + fVar53 +
                       (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74
                         + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74) +
                       fVar53;
                  auVar55 = maxps(auVar75,_DAT_005b48d0);
                  fVar71 = (float)(auVar55._0_4_ & 0x807fffff | 0x3f000000);
                  fVar73 = (float)(auVar55._4_4_ & 0x807fffff | 0x3f000000);
                  fVar66 = (float)(auVar55._8_4_ & 0x807fffff | 0x3f000000);
                  fVar69 = (float)(auVar55._12_4_ & 0x807fffff | 0x3f000000);
                  fVar72 = fVar71 + -1.0 + (float)(-(uint)(fVar71 < 0.70710677) & (uint)fVar71);
                  fVar74 = fVar73 + -1.0 + (float)(-(uint)(fVar73 < 0.70710677) & (uint)fVar73);
                  fVar68 = fVar66 + -1.0 + (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar66);
                  fVar70 = fVar69 + -1.0 + (float)(-(uint)(fVar69 < 0.70710677) & (uint)fVar69);
                  auVar56._0_8_ =
                       CONCAT44(-(uint)(auVar75._4_4_ <= 0.0),-(uint)(auVar75._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar56._8_4_ = -(uint)(auVar75._8_4_ <= 0.0) & 0x7fffffff;
                  auVar56._12_4_ = -(uint)(auVar75._12_4_ <= 0.0) & 0x7fffffff;
                  auVar13._4_4_ =
                       ~-(uint)(auVar75._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar55._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar73 < 0.70710677) & (uint)fVar51)) * 0.6931472 +
                               fVar74 + (((((((((fVar74 * 0.070376836 + -0.1151461) * fVar74 +
                                               0.116769984) * fVar74 + -0.12420141) * fVar74 +
                                             0.14249323) * fVar74 + -0.16668057) * fVar74 +
                                           0.20000714) * fVar74 + -0.24999994) * fVar74 + 0.3333333)
                                         * fVar74 + -0.5) * fVar74 * fVar74) * -2.0);
                  auVar13._0_4_ =
                       ~-(uint)(auVar75._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar55._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar71 < 0.70710677) & (uint)fVar50)) * 0.6931472 +
                               fVar72 + (((((((((fVar72 * 0.070376836 + -0.1151461) * fVar72 +
                                               0.116769984) * fVar72 + -0.12420141) * fVar72 +
                                             0.14249323) * fVar72 + -0.16668057) * fVar72 +
                                           0.20000714) * fVar72 + -0.24999994) * fVar72 + 0.3333333)
                                         * fVar72 + -0.5) * fVar72 * fVar72) * -2.0);
                  auVar13._8_4_ =
                       ~-(uint)(auVar75._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar55._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar52)) * 0.6931472 +
                               fVar68 + (((((((((fVar68 * 0.070376836 + -0.1151461) * fVar68 +
                                               0.116769984) * fVar68 + -0.12420141) * fVar68 +
                                             0.14249323) * fVar68 + -0.16668057) * fVar68 +
                                           0.20000714) * fVar68 + -0.24999994) * fVar68 + 0.3333333)
                                         * fVar68 + -0.5) * fVar68 * fVar68) * -2.0);
                  auVar13._12_4_ =
                       ~-(uint)(auVar75._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar55._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar69 < 0.70710677) & (uint)fVar53)) * 0.6931472 +
                               fVar70 + (((((((((fVar70 * 0.070376836 + -0.1151461) * fVar70 +
                                               0.116769984) * fVar70 + -0.12420141) * fVar70 +
                                             0.14249323) * fVar70 + -0.16668057) * fVar70 +
                                           0.20000714) * fVar70 + -0.24999994) * fVar70 + 0.3333333)
                                         * fVar70 + -0.5) * fVar70 * fVar70) * -2.0);
                  auVar55 = minps(auVar56 | auVar13,auVar11);
                  auVar55 = maxps(auVar55,_DAT_005b4830);
                  fVar71 = auVar55._0_4_ * 1.442695 + 0.5;
                  fVar72 = auVar55._4_4_ * 1.442695 + 0.5;
                  fVar73 = auVar55._8_4_ * 1.442695 + 0.5;
                  fVar74 = auVar55._12_4_ * 1.442695 + 0.5;
                  fVar66 = (float)(int)fVar71;
                  fVar68 = (float)(int)fVar72;
                  fVar69 = (float)(int)fVar73;
                  fVar70 = (float)(int)fVar74;
                  fVar66 = fVar66 - (float)(-(uint)(fVar71 < fVar66) & (uint)fVar50);
                  fVar68 = fVar68 - (float)(-(uint)(fVar72 < fVar68) & (uint)fVar51);
                  fVar69 = fVar69 - (float)(-(uint)(fVar73 < fVar69) & (uint)fVar52);
                  fVar70 = fVar70 - (float)(-(uint)(fVar74 < fVar70) & (uint)fVar53);
                  fVar71 = auVar55._0_4_ - fVar66 * 0.6931472;
                  fVar72 = auVar55._4_4_ - fVar68 * 0.6931472;
                  fVar73 = auVar55._8_4_ - fVar69 * 0.6931472;
                  fVar74 = auVar55._12_4_ - fVar70 * 0.6931472;
                  auVar49 = ZEXT816(0);
                  auVar14._4_4_ =
                       (float)((int)fVar68 * 0x800000 + (int)fVar51) *
                       (fVar72 + fVar51 +
                       (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72
                         + 0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72) +
                       fVar51;
                  auVar14._0_4_ =
                       (float)((int)fVar66 * 0x800000 + (int)fVar50) *
                       (fVar71 + fVar50 +
                       (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71
                         + 0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) * fVar71 * fVar71) +
                       fVar50;
                  auVar14._8_4_ =
                       (float)((int)fVar69 * 0x800000 + (int)fVar52) *
                       (fVar73 + fVar52 +
                       (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73
                         + 0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73) +
                       fVar52;
                  auVar14._12_4_ =
                       (float)((int)fVar70 * 0x800000 + (int)fVar53) *
                       (fVar74 + fVar53 +
                       (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74
                         + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74) +
                       fVar53;
                  auVar55 = divps(_DAT_005b54e0,auVar14);
                  auVar60._0_4_ = auVar55._0_4_ + -1.0;
                  auVar60._4_4_ = auVar55._4_4_ + -1.0;
                  auVar60._8_4_ = auVar55._8_4_ + -1.0;
                  auVar60._12_4_ = auVar55._12_4_ + -1.0;
                  auVar55 = _DAT_005b4830;
                  goto LAB_0043336e;
                case 6:
                  pfVar1 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                  fVar53 = *pfVar1;
                  fVar71 = pfVar1[1];
                  auVar58._0_4_ = fVar53 * auVar64._0_4_ + fVar71;
                  auVar58._4_4_ = fVar53 * fVar54 + fVar71;
                  auVar58._8_4_ = fVar53 * fVar67 + fVar71;
                  auVar58._12_4_ = fVar53 * fVar61 + fVar71;
                  auVar59 = maxps(auVar58,auVar49);
                  auVar60 = minps(auVar59,auVar12);
LAB_0043336e:
                  auVar64._0_4_ = auVar64._0_4_ * auVar60._0_4_;
                  auVar64._4_4_ = fVar54 * auVar60._4_4_;
                  auVar64._8_4_ = fVar67 * auVar60._8_4_;
                  auVar64._12_4_ = fVar61 * auVar60._12_4_;
                }
                *local_1f0 = auVar64;
                pauVar39 = local_1f0 + 1;
                iVar34 = iVar34 + 1;
                local_258 = local_258 + 1;
              } while (iVar34 != iVar38);
            }
            iVar26 = iVar26 + 1;
          } while (iVar26 != iVar4);
        }
        local_260 = (void *)((long)local_260 + 1);
      } while (local_260 != (void *)(ulong)uVar30);
    }
  }
  else {
    uVar27 = (int)(uVar30 * iVar48) / iVar26;
    uVar28 = iVar22 / iVar26;
    iVar29 = 1;
    uVar30 = 1;
    if (opt->use_packing_layout == true) {
      iVar29 = (uint)((uVar27 & 3) == 0) * 3 + 1;
      uVar30 = (uint)((uVar28 & 3) == 0) * 3 + 1;
    }
    local_170.data = bottom_blob->data;
    local_170.refcount = bottom_blob->refcount;
    local_170.elemsize = bottom_blob->elemsize;
    local_170.elempack = bottom_blob->elempack;
    local_170.allocator = bottom_blob->allocator;
    local_170.dims = bottom_blob->dims;
    local_170.w = bottom_blob->w;
    local_170.h = bottom_blob->h;
    local_170.d = bottom_blob->d;
    local_170.c = bottom_blob->c;
    local_170.cstep = bottom_blob->cstep;
    if (local_170.refcount != (int *)0x0) {
      LOCK();
      *local_170.refcount = *local_170.refcount + 1;
      UNLOCK();
    }
    if (iVar29 < iVar48) {
      local_1e8.data = *(void **)opt;
      local_1e8.elemsize = (size_t)opt->workspace_allocator;
      local_1e8.elempack = opt->openmp_blocktime;
      local_1e8._28_1_ = opt->use_winograd_convolution;
      local_1e8._29_1_ = opt->use_sgemm_convolution;
      local_1e8._30_1_ = opt->use_int8_inference;
      local_1e8._31_1_ = opt->use_vulkan_compute;
      local_1e8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1e8._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
      local_1e8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1e8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
      local_1e8.refcount = (int *)opt->workspace_allocator;
      convert_packing(bottom_blob,&local_170,iVar29,(Option *)&local_1e8);
      if (local_170.data == (void *)0x0) {
        iVar22 = -100;
        bVar19 = false;
      }
      else {
        if ((long)local_170.c * local_170.cstep != 0) goto LAB_0043350c;
        bVar19 = false;
        iVar22 = -100;
      }
    }
    else {
LAB_0043350c:
      local_1e8.refcount = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      local_1e8.data = local_248.data;
      local_1e8.elemsize = local_248.elemsize;
      local_1e8.elempack = local_248.elempack;
      local_1e8.allocator = local_248.allocator;
      local_1e8.w = local_248.w;
      local_1e8.dims = local_248.dims;
      local_1e8.h = local_248.h;
      local_1e8.d = local_248.d;
      local_1e8.c = local_248.c;
      local_1e8.cstep = local_248.cstep;
      if ((Allocator *)local_1e8.refcount != (Allocator *)0x0) {
        LOCK();
        *(int *)&((Allocator *)local_1e8.refcount)->_vptr_Allocator =
             *(int *)&((Allocator *)local_1e8.refcount)->_vptr_Allocator + 1;
        UNLOCK();
      }
      if ((uVar30 < uVar36) &&
         ((Mat::create(&local_1e8,iVar38,iVar4,
                       (this->super_DeconvolutionDepthWise).num_output / (int)uVar30,
                       (ulong)uVar30 * (uVar43 >> sVar32),uVar30,opt->workspace_allocator),
          local_1e8.data == (void *)0x0 || ((long)local_1e8.c * local_1e8.cstep == 0)))) {
LAB_00433937:
        iVar22 = -100;
        bVar19 = false;
      }
      else {
        if (0 < (this->super_DeconvolutionDepthWise).group) {
          iVar48 = 0;
          iVar45 = 0;
          lVar46 = 0;
          do {
            local_c0 = (void *)((long)(iVar48 / iVar29) * local_170.cstep * local_170.elemsize +
                               (long)local_170.data);
            local_b8 = (int *)0x0;
            local_b0 = local_170.elemsize;
            local_a8 = local_170.elempack;
            local_a0 = local_170.allocator;
            local_94 = local_170.w;
            local_90 = local_170.h;
            local_8c = local_170.d;
            local_80 = ((long)local_170.d * local_170.elemsize *
                        (long)local_170.h * (long)local_170.w + 0xf & 0xfffffffffffffff0) /
                       local_170.elemsize;
            local_98 = local_170.dims;
            local_108 = (void *)((long)(iVar45 / (int)uVar30) * local_1e8.cstep * local_1e8.elemsize
                                + (long)local_1e8.data);
            local_100 = (int *)0x0;
            local_f8 = (Allocator *)local_1e8.elemsize;
            local_f0 = local_1e8.elempack;
            local_e8 = local_1e8.allocator;
            local_dc = local_1e8.w;
            local_d8 = local_1e8.h;
            local_d4 = local_1e8.d;
            local_c8 = ((long)local_1e8.d * local_1e8.elemsize *
                        (long)local_1e8.h * (long)local_1e8.w + 0xf & 0xfffffffffffffff0) /
                       local_1e8.elemsize;
            local_e0 = local_1e8.dims;
            pLVar10 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar46];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            local_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            local_58._0_1_ = opt->use_bf16_storage;
            local_58._1_1_ = opt->use_fp16_packed;
            local_58._2_1_ = opt->use_fp16_storage;
            local_58._3_1_ = opt->use_fp16_arithmetic;
            local_58._4_1_ = opt->use_int8_packed;
            local_58._5_1_ = opt->use_int8_storage;
            local_58._6_1_ = opt->use_int8_arithmetic;
            local_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            local_48 = opt->flush_denormals;
            uStack_44._0_1_ = opt->use_local_pool_allocator;
            uStack_44._1_1_ = opt->use_shader_local_memory;
            uStack_44._2_1_ = opt->use_cooperative_matrix;
            uStack_44._3_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_3c._0_1_ = opt->use_int8_uniform;
            uStack_3c._1_1_ = opt->use_reserved_9;
            uStack_3c._2_1_ = opt->use_reserved_10;
            uStack_3c._3_1_ = opt->use_reserved_11;
            pAStack_70 = local_1e8.allocator;
            local_d0 = (int)uVar28 / (int)uVar30;
            local_88 = (int)uVar27 / iVar29;
            iVar22 = (*pLVar10->_vptr_Layer[7])(pLVar10,&local_c0,&local_108,&local_78);
            if (local_100 != (int *)0x0) {
              LOCK();
              *local_100 = *local_100 + -1;
              UNLOCK();
              if (*local_100 == 0) {
                if (local_e8 == (Allocator *)0x0) {
                  if (local_108 != (void *)0x0) {
                    free(local_108);
                  }
                }
                else {
                  (*local_e8->_vptr_Allocator[3])();
                }
              }
            }
            if (local_b8 != (int *)0x0) {
              LOCK();
              *local_b8 = *local_b8 + -1;
              UNLOCK();
              if (*local_b8 == 0) {
                if (local_a0 == (Allocator *)0x0) {
                  if (local_c0 != (void *)0x0) {
                    free(local_c0);
                  }
                }
                else {
                  (*local_a0->_vptr_Allocator[3])();
                }
              }
            }
            if (iVar22 != 0) {
              bVar19 = false;
              goto LAB_00433eb9;
            }
            lVar46 = lVar46 + 1;
            iVar45 = iVar45 + uVar28;
            iVar48 = iVar48 + uVar27;
          } while (lVar46 < (this->super_DeconvolutionDepthWise).group);
        }
        if (uVar30 < uVar36) {
          convert_packing(&local_1e8,&local_248,uVar36,opt);
          if ((local_248.data == (void *)0x0) || ((long)local_248.c * local_248.cstep == 0))
          goto LAB_00433937;
        }
        else {
          if ((Allocator *)local_1e8.refcount != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_1e8.refcount =
                 *(int *)(_func_int ***)local_1e8.refcount + 1;
            UNLOCK();
          }
          piVar6 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_248.allocator == (Allocator *)0x0) {
                if (local_248.data != (void *)0x0) {
                  free(local_248.data);
                }
              }
              else {
                (*(local_248.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_248.data = local_1e8.data;
          local_248.refcount._0_4_ = SUB84(local_1e8.refcount,0);
          local_248.refcount._4_4_ = (undefined4)((ulong)local_1e8.refcount >> 0x20);
          local_248.elemsize = local_1e8.elemsize;
          local_248.elempack = local_1e8.elempack;
          local_248.allocator = local_1e8.allocator;
          local_248.dims = local_1e8.dims;
          local_248.w = local_1e8.w;
          local_248.h = local_1e8.h;
          local_248.d = local_1e8.d;
          local_248.c = local_1e8.c;
          local_248.cstep = local_1e8.cstep;
        }
        iVar22 = -100;
        bVar19 = true;
      }
LAB_00433eb9:
      if ((Allocator *)local_1e8.refcount != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_1e8.refcount = *(int *)(_func_int ***)local_1e8.refcount + -1;
        UNLOCK();
        if (*(int *)(_func_int ***)local_1e8.refcount == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (local_170.refcount != (int *)0x0) {
      LOCK();
      *local_170.refcount = *local_170.refcount + -1;
      UNLOCK();
      if (*local_170.refcount == 0) {
        if (local_170.allocator == (Allocator *)0x0) {
          if (local_170.data != (void *)0x0) {
            free(local_170.data);
          }
        }
        else {
          (*(local_170.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar19) goto LAB_00433f88;
  }
  pMVar20 = local_200;
  DeconvolutionDepthWise::cut_padding(&this->super_DeconvolutionDepthWise,&local_248,local_200,opt);
  if ((pMVar20->data == (void *)0x0) || (iVar22 = 0, (long)local_200->c * local_200->cstep == 0)) {
    iVar22 = -100;
  }
LAB_00433f88:
  piVar6 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

int DeconvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}